

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

int dump_elem(lyout *out,lyxml_elem *e,int level,int options,int last_elem)

{
  int iVar1;
  int iVar2;
  lyxml_elem *local_80;
  lyxml_elem *local_70;
  uint local_54;
  char *pcStack_50;
  int indent;
  char *delim_outer;
  char *delim;
  lyxml_elem *child;
  lyxml_attr *a;
  int size;
  int last_elem_local;
  int options_local;
  int level_local;
  lyxml_elem *e_local;
  lyout *out_local;
  
  a._0_4_ = 0;
  if (e->name == (char *)0x0) {
    if (e->content != (char *)0x0) {
      iVar1 = lyxml_dump_text(out,e->content,LYXML_DATA_ELEM);
      return iVar1;
    }
    return 0;
  }
  pcStack_50 = "";
  if ((options & 2U) != 0) {
    pcStack_50 = "\n";
  }
  local_54 = level << 1;
  if (((e->flags & 1U) != 0) ||
     ((delim_outer = pcStack_50, e->parent != (lyxml_elem *)0x0 && ((e->parent->flags & 1U) != 0))))
  {
    delim_outer = "";
  }
  if ((e->parent != (lyxml_elem *)0x0) && ((e->parent->flags & 1U) != 0)) {
    pcStack_50 = "";
    local_54 = 0;
  }
  if ((last_elem != 0) && ((options & 0x20U) != 0)) {
    pcStack_50 = "";
  }
  if (((options & 0xdU) == 0) || ((options & 1U) != 0)) {
    if ((e->ns == (lyxml_ns *)0x0) || (e->ns->prefix == (char *)0x0)) {
      a._0_4_ = ly_print(out,"%*s<%s",(ulong)local_54,"");
    }
    else {
      a._0_4_ = ly_print(out,"%*s<%s:%s",(ulong)local_54,"",e->ns->prefix,e->name);
    }
  }
  else if ((options & 4U) != 0) {
    local_54 = 0;
    goto LAB_00130bc5;
  }
  for (child = (lyxml_elem *)e->attr; child != (lyxml_elem *)0x0; child = child->parent) {
    if (*(int *)child == 2) {
      if (child->child == (lyxml_elem *)0x0) {
        if (child->next == (lyxml_elem *)0x0) {
          local_80 = (lyxml_elem *)0x1eea57;
        }
        else {
          local_80 = child->next;
        }
        iVar1 = ly_print(out," xmlns=\"%s\"",local_80);
      }
      else {
        if (child->next == (lyxml_elem *)0x0) {
          local_70 = (lyxml_elem *)0x1eea57;
        }
        else {
          local_70 = child->next;
        }
        iVar1 = ly_print(out," xmlns:%s=\"%s\"",child->child,local_70);
      }
    }
    else if ((child->attr == (lyxml_attr *)0x0) || (child->attr->name == (char *)0x0)) {
      iVar1 = ly_print(out," %s=\"%s\"",child->child,child->next);
    }
    else {
      iVar1 = ly_print(out," %s:%s=\"%s\"",child->attr->name,child->child);
    }
    a._0_4_ = iVar1 + (int)a;
  }
  if (((options & 4U) != 0) && ((options & 1U) != 0)) {
    iVar1 = ly_print(out,"/>%s",delim_outer);
    return iVar1 + (int)a;
  }
  if ((options & 1U) != 0) {
    ly_print(out,">");
    return (int)a + 1;
  }
  if ((options & 8U) != 0) {
    return (int)a;
  }
  if ((e->child == (lyxml_elem *)0x0) && ((e->content == (char *)0x0 || (*e->content == '\0')))) {
    iVar1 = ly_print(out,"/>%s",delim_outer);
    return iVar1 + (int)a;
  }
  if ((e->content != (char *)0x0) && (*e->content != '\0')) {
    ly_print(out,">");
    iVar1 = lyxml_dump_text(out,e->content,LYXML_DATA_ELEM);
    if ((e->ns == (lyxml_ns *)0x0) || (e->ns->prefix == (char *)0x0)) {
      iVar2 = ly_print(out,"</%s>%s",e->name,delim_outer);
    }
    else {
      iVar2 = ly_print(out,"</%s:%s>%s",e->ns->prefix,e->name,delim_outer);
    }
    a._0_4_ = iVar2 + iVar1 + (int)a + 1;
    return (int)a;
  }
  iVar1 = ly_print(out,">%s",delim_outer);
  a._0_4_ = iVar1 + (int)a;
  for (delim = &e->child->flags; delim != (char *)0x0; delim = *(char **)(delim + 0x20)) {
    if ((options & 2U) == 0) {
      iVar1 = dump_elem(out,(lyxml_elem *)delim,level,0,0);
    }
    else {
      iVar1 = dump_elem(out,(lyxml_elem *)delim,level + 1,2,0);
    }
    a._0_4_ = iVar1 + (int)a;
  }
LAB_00130bc5:
  if ((e->ns == (lyxml_ns *)0x0) || (e->ns->prefix == (char *)0x0)) {
    iVar1 = ly_print(out,"%*s</%s>%s",(ulong)local_54,"",e->name,pcStack_50);
  }
  else {
    iVar1 = ly_print(out,"%*s</%s:%s>%s",(ulong)local_54,"",e->ns->prefix,e->name,pcStack_50);
  }
  a._0_4_ = iVar1 + (int)a;
  return (int)a;
}

Assistant:

static int
dump_elem(struct lyout *out, const struct lyxml_elem *e, int level, int options, int last_elem)
{
    int size = 0;
    struct lyxml_attr *a;
    struct lyxml_elem *child;
    const char *delim, *delim_outer;
    int indent;

    if (!e->name) {
        /* mixed content */
        if (e->content) {
            return lyxml_dump_text(out, e->content, LYXML_DATA_ELEM);
        } else {
            return 0;
        }
    }

    delim = delim_outer = (options & LYXML_PRINT_FORMAT) ? "\n" : "";
    indent = 2 * level;
    if ((e->flags & LYXML_ELEM_MIXED) || (e->parent && (e->parent->flags & LYXML_ELEM_MIXED))) {
        delim = "";
    }
    if (e->parent && (e->parent->flags & LYXML_ELEM_MIXED)) {
        delim_outer = "";
        indent = 0;
    }
    if (last_elem && (options & LYXML_PRINT_NO_LAST_NEWLINE)) {
        delim_outer = "";
    }

    if (!(options & (LYXML_PRINT_OPEN | LYXML_PRINT_CLOSE | LYXML_PRINT_ATTRS)) || (options & LYXML_PRINT_OPEN))  {
        /* opening tag */
        if (e->ns && e->ns->prefix) {
            size += ly_print(out, "%*s<%s:%s", indent, "", e->ns->prefix, e->name);
        } else {
            size += ly_print(out, "%*s<%s", indent, "", e->name);
        }
    } else if (options & LYXML_PRINT_CLOSE) {
        indent = 0;
        goto close;
    }

    /* attributes */
    for (a = e->attr; a; a = a->next) {
        if (a->type == LYXML_ATTR_NS) {
            if (a->name) {
                size += ly_print(out, " xmlns:%s=\"%s\"", a->name, a->value ? a->value : "");
            } else {
                size += ly_print(out, " xmlns=\"%s\"", a->value ? a->value : "");
            }
        } else if (a->ns && a->ns->prefix) {
            size += ly_print(out, " %s:%s=\"%s\"", a->ns->prefix, a->name, a->value);
        } else {
            size += ly_print(out, " %s=\"%s\"", a->name, a->value);
        }
    }

    /* apply options */
    if ((options & LYXML_PRINT_CLOSE) && (options & LYXML_PRINT_OPEN)) {
        size += ly_print(out, "/>%s", delim);
        return size;
    } else if (options & LYXML_PRINT_OPEN) {
        ly_print(out, ">");
        return ++size;
    } else if (options & LYXML_PRINT_ATTRS) {
        return size;
    }

    if (!e->child && (!e->content || !e->content[0])) {
        size += ly_print(out, "/>%s", delim);
        return size;
    } else if (e->content && e->content[0]) {
        ly_print(out, ">");
        size++;

        size += lyxml_dump_text(out, e->content, LYXML_DATA_ELEM);

        if (e->ns && e->ns->prefix) {
            size += ly_print(out, "</%s:%s>%s", e->ns->prefix, e->name, delim);
        } else {
            size += ly_print(out, "</%s>%s", e->name, delim);
        }
        return size;
    } else {
        size += ly_print(out, ">%s", delim);
    }

    /* go recursively */
    LY_TREE_FOR(e->child, child) {
        if (options & LYXML_PRINT_FORMAT) {
            size += dump_elem(out, child, level + 1, LYXML_PRINT_FORMAT, 0);
        } else {
            size += dump_elem(out, child, level, 0, 0);
        }
    }

close:
    /* closing tag */
    if (e->ns && e->ns->prefix) {
        size += ly_print(out, "%*s</%s:%s>%s", indent, "", e->ns->prefix, e->name, delim_outer);
    } else {
        size += ly_print(out, "%*s</%s>%s", indent, "", e->name, delim_outer);
    }

    return size;
}